

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void expandFormatArguments<char>(vector<String,_std::allocator<String>_> *data,char *arg)

{
  value_type local_28;
  
  local_28._string._M_dataplus._M_p = (pointer)&local_28._string.field_2;
  local_28._string.field_2._M_allocated_capacity._0_2_ = ZEXT12((byte)*arg);
  local_28._string._M_string_length = 2;
  local_28._string.field_2._M_local_buf[2] = '\0';
  std::vector<String,_std::allocator<String>_>::push_back(data,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

FormatArgument (const T& a) :
		m_text (MakeFormatArgument (a)) {}